

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void __thiscall DStrobe::Serialize(DStrobe *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DSectorEffect::Serialize((DSectorEffect *)this,arc);
  pFVar1 = FSerializer::operator()(arc,"count",&this->m_Count);
  pFVar1 = FSerializer::operator()(pFVar1,"maxlight",&this->m_MaxLight);
  pFVar1 = FSerializer::operator()(pFVar1,"minlight",&this->m_MinLight);
  pFVar1 = FSerializer::operator()(pFVar1,"darktime",&this->m_DarkTime);
  FSerializer::operator()(pFVar1,"brighttime",&this->m_BrightTime);
  return;
}

Assistant:

void DStrobe::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("count", m_Count)
		("maxlight", m_MaxLight)
		("minlight", m_MinLight)
		("darktime", m_DarkTime)
		("brighttime", m_BrightTime);
}